

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O2

void cfd::UtxoUtil::ConvertToUtxo(UtxoData *utxo_data,Utxo *utxo,UtxoData *dest)

{
  undefined8 uVar1;
  _Base_ptr p_Var2;
  DescriptorScriptReference *this;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  pointer pAVar11;
  AddressType AVar12;
  bool bVar13;
  uint32_t uVar14;
  DescriptorScriptType DVar15;
  uint64_t uVar16;
  int64_t iVar17;
  ulong uVar18;
  uint16_t uVar19;
  NetType net_type;
  Script *pSVar20;
  ConfidentialAssetId *this_00;
  uint32_t txin_size;
  undefined4 uStack_934;
  pointer local_930;
  uint32_t wit_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> locking_script_bytes;
  ByteData txid;
  ByteData block_hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_8c0;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  elements_prefixes;
  Script local_730;
  Script local_6f8;
  Script local_6c0;
  Descriptor desc;
  UtxoData output;
  
  if (utxo == (Utxo *)0x0) {
    return;
  }
  UtxoData::UtxoData(&output,utxo_data);
  memset(utxo,0,0xd8);
  utxo->block_height = utxo_data->block_height;
  utxo->vout = utxo_data->vout;
  utxo->binary_data = utxo_data->binary_data;
  uVar16 = core::Amount::GetSatoshiValue(&utxo_data->amount);
  utxo->amount = uVar16;
  core::BlockHash::GetData(&block_hash,&utxo_data->block_hash);
  bVar13 = core::ByteData::Empty(&block_hash);
  if (!bVar13) {
    core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes,
               &block_hash);
    uVar3 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
    uVar4 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
    uVar5 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
    uVar6 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
    uVar7 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
    uVar8 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
    uVar9 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
    uVar10 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
    uVar1 = *(undefined8 *)
             &((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header
              ._M_header;
    p_Var2 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    *(_Base_ptr *)(utxo->block_hash + 0x10) =
         ((elements_prefixes.
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
         _M_header._M_parent;
    *(_Base_ptr *)(utxo->block_hash + 0x18) = p_Var2;
    utxo->block_hash[0] = uVar3;
    utxo->block_hash[1] = uVar4;
    utxo->block_hash[2] = uVar5;
    utxo->block_hash[3] = uVar6;
    utxo->block_hash[4] = uVar7;
    utxo->block_hash[5] = uVar8;
    utxo->block_hash[6] = uVar9;
    utxo->block_hash[7] = uVar10;
    *(undefined8 *)(utxo->block_hash + 8) = uVar1;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
  }
  core::Txid::GetData(&txid,&utxo_data->txid);
  bVar13 = core::ByteData::Empty(&txid);
  if (!bVar13) {
    core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes,&txid);
    uVar3 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
    uVar4 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
    uVar5 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
    uVar6 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
    uVar7 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
    uVar8 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
    uVar9 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
    uVar10 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
    uVar1 = *(undefined8 *)
             &((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header
              ._M_header;
    p_Var2 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    *(_Base_ptr *)(utxo->txid + 0x10) =
         ((elements_prefixes.
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
         _M_header._M_parent;
    *(_Base_ptr *)(utxo->txid + 0x18) = p_Var2;
    utxo->txid[0] = uVar3;
    utxo->txid[1] = uVar4;
    utxo->txid[2] = uVar5;
    utxo->txid[3] = uVar6;
    utxo->txid[4] = uVar7;
    utxo->txid[5] = uVar8;
    utxo->txid[6] = uVar9;
    utxo->txid[7] = uVar10;
    *(undefined8 *)(utxo->txid + 8) = uVar1;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
  }
  locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((utxo_data->descriptor)._M_string_length != 0) {
    core::GetBitcoinAddressFormatList();
    bVar13 = core::ConfidentialAssetId::IsEmpty(&utxo_data->asset);
    net_type = kMainnet;
    if (!bVar13) {
      core::GetElementsAddressFormatList();
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      operator=((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 *)&wit_size,&elements_prefixes);
      net_type = kLiquidV1;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&elements_prefixes);
    }
    core::Address::GetAddress_abi_cxx11_((string *)&elements_prefixes,&utxo_data->address);
    pAVar11 = elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::~string((string *)&elements_prefixes);
    if (pAVar11 != (pointer)0x0) {
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      clear((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &wit_size);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&elements_prefixes,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&(utxo_data->address).format_data_);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      emplace_back<cfd::core::AddressFormatData>
                ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)&wit_size,(AddressFormatData *)&elements_prefixes);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&elements_prefixes);
      net_type = (utxo_data->address).type_;
    }
    core::Descriptor::Parse
              (&desc,&utxo_data->descriptor,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)&wit_size);
    uVar14 = core::Descriptor::GetNeedArgumentNum(&desc);
    if (uVar14 == 0) {
      core::Descriptor::GetReferenceAll
                ((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)&txin_size,&desc,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      this = (DescriptorScriptReference *)CONCAT44(uStack_934,txin_size);
      core::DescriptorScriptReference::GetLockingScript((Script *)&elements_prefixes,this);
      core::Script::operator=(&output.locking_script,(Script *)&elements_prefixes);
      core::Script::~Script((Script *)&elements_prefixes);
      core::Script::GetData((ByteData *)&local_8c0,&output.locking_script);
      core::ByteData::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes,
                 (ByteData *)&local_8c0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&locking_script_bytes,
                 (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_8c0);
      DVar15 = core::DescriptorScriptReference::GetScriptType(this);
      if ((DVar15 != kDescriptorScriptRaw) ||
         (bVar13 = core::DescriptorScriptReference::HasAddress(this), bVar13)) {
        output.address_type = core::DescriptorScriptReference::GetAddressType(this);
        core::DescriptorScriptReference::GenerateAddress
                  ((Address *)&elements_prefixes,this,net_type);
        core::Address::operator=(&output.address,(Address *)&elements_prefixes);
        core::Address::~Address((Address *)&elements_prefixes);
        bVar13 = core::DescriptorScriptReference::HasRedeemScript(local_930 + -1);
        if (bVar13) {
          core::DescriptorScriptReference::GetRedeemScript
                    ((Script *)&elements_prefixes,local_930 + -1);
          core::Script::operator=(&output.redeem_script,(Script *)&elements_prefixes);
          core::Script::~Script((Script *)&elements_prefixes);
        }
      }
      utxo->address_type = (undefined2)output.address_type;
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                 *)&txin_size);
    }
    core::DescriptorNode::~DescriptorNode(&desc.root_node_);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &wit_size);
    if (locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) goto LAB_00322712;
  }
  core::Address::GetAddress_abi_cxx11_((string *)&elements_prefixes,&output.address);
  std::__cxx11::string::~string((string *)&elements_prefixes);
  if (elements_prefixes.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    core::Address::GetLockingScript((Script *)&elements_prefixes,&output.address);
    core::Script::operator=(&output.locking_script,(Script *)&elements_prefixes);
    core::Script::~Script((Script *)&elements_prefixes);
    core::Script::GetData((ByteData *)&desc,&output.locking_script);
    core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes,
               (ByteData *)&desc);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&locking_script_bytes,
               (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&desc);
    if ((output.address.addr_type_ != kP2shAddress) || (1 < output.address_type - kP2shP2wshAddress)
       ) {
      output.address_type = output.address.addr_type_;
    }
    utxo->address_type = (uint16_t)output.address_type;
    goto LAB_00322712;
  }
  pSVar20 = &utxo_data->locking_script;
  bVar13 = core::Script::IsEmpty(pSVar20);
  if (bVar13) goto LAB_00322712;
  core::Script::GetData((ByteData *)&desc,pSVar20);
  core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes,
             (ByteData *)&desc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&locking_script_bytes,
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&desc);
  bVar13 = core::Script::IsP2wpkhScript(pSVar20);
  if (bVar13) {
    output.address_type = kP2wpkhAddress;
    uVar19 = 4;
  }
  else {
    bVar13 = core::Script::IsP2wshScript(pSVar20);
    if (bVar13) {
      output.address_type = kP2wshAddress;
      uVar19 = 3;
    }
    else {
      bVar13 = core::Script::IsP2pkhScript(pSVar20);
      if (bVar13) {
        output.address_type = kP2pkhAddress;
        uVar19 = 2;
      }
      else {
        bVar13 = core::Script::IsTaprootScript(pSVar20);
        if (bVar13) {
          output.address_type = kTaprootAddress;
          uVar19 = 7;
        }
        else {
          bVar13 = core::Script::IsWitnessProgram(pSVar20);
          if (bVar13) {
            core::Script::GetElementList
                      ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        *)&elements_prefixes,pSVar20);
            iVar17 = core::ScriptElement::GetNumber
                               ((ScriptElement *)
                                elements_prefixes.
                                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                ._M_impl.super__Vector_impl_data._M_start);
            std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
            ~vector((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                    &elements_prefixes);
            if (iVar17 != 0) {
              output.address_type = kWitnessUnknown;
              uVar19 = 8;
              goto LAB_00322706;
            }
          }
          output.address_type = kP2shAddress;
          uVar19 = 1;
        }
      }
    }
  }
LAB_00322706:
  utxo->address_type = uVar19;
LAB_00322712:
  if (locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start !=
      locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    uVar18 = (long)locking_script_bytes.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)locking_script_bytes.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    utxo->script_length = (uint16_t)uVar18;
    if (((uint)uVar18 & 0xfff8) < 0x28) {
      memcpy(utxo->locking_script,
             locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,uVar18 & 0xffff);
    }
  }
  wit_size = 0;
  txin_size = 0;
  bVar13 = core::Script::IsEmpty(&output.scriptsig_template);
  pSVar20 = &output.scriptsig_template;
  if (bVar13) {
    pSVar20 = (Script *)0x0;
  }
  this_00 = &utxo_data->asset;
  bVar13 = core::ConfidentialAssetId::IsEmpty(this_00);
  if (!bVar13) {
    core::ConfidentialAssetId::GetData((ByteData *)&desc,this_00);
    core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes,
               (ByteData *)&desc);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&desc);
    utxo->asset[0x20] =
         *(uint8_t *)
          &((elements_prefixes.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_right;
    uVar3 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
    uVar4 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
    uVar5 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
    uVar6 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
    uVar7 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
    uVar8 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
    uVar9 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
    uVar10 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
    uVar1 = *(undefined8 *)
             &((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header
              ._M_header;
    p_Var2 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    *(_Base_ptr *)(utxo->asset + 0x10) =
         ((elements_prefixes.
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
         _M_header._M_parent;
    *(_Base_ptr *)(utxo->asset + 0x18) = p_Var2;
    utxo->asset[0] = uVar3;
    utxo->asset[1] = uVar4;
    utxo->asset[2] = uVar5;
    utxo->asset[3] = uVar6;
    utxo->asset[4] = uVar7;
    utxo->asset[5] = uVar8;
    utxo->asset[6] = uVar9;
    utxo->asset[7] = uVar10;
    *(undefined8 *)(utxo->asset + 8) = uVar1;
    bVar13 = core::ConfidentialAssetId::HasBlinding(this_00);
    AVar12 = output.address_type;
    utxo->blinded = bVar13;
    core::Script::Script(&local_6c0,&output.redeem_script);
    core::Script::Script(&local_6f8);
    core::ConfidentialTxIn::EstimateTxInSize
              (AVar12,&local_6c0,0,&local_6f8,false,false,&wit_size,&txin_size,false,pSVar20,0,0x34,
               (uint32_t *)0x0,0);
    core::Script::~Script(&local_6f8);
    core::Script::~Script(&local_6c0);
    txin_size = txin_size - 0x29;
    utxo->witness_size_max = (uint16_t)wit_size;
    utxo->uscript_size_max = (uint16_t)txin_size;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
  }
  AVar12 = output.address_type;
  if (txin_size == 0 && wit_size == 0) {
    wit_size = 0;
    txin_size = 0;
    core::Script::Script(&local_730,&output.redeem_script);
    core::TxIn::EstimateTxInSize(AVar12,&local_730,&wit_size,&txin_size,pSVar20);
    core::Script::~Script(&local_730);
    txin_size = txin_size - 0x29;
    utxo->witness_size_max = (uint16_t)wit_size;
    utxo->uscript_size_max = (uint16_t)txin_size;
  }
  if (dest != (UtxoData *)0x0) {
    UtxoData::operator=(dest,&output);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txid);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&block_hash);
  UtxoData::~UtxoData(&output);
  return;
}

Assistant:

void UtxoUtil::ConvertToUtxo(
    const UtxoData& utxo_data, Utxo* utxo, UtxoData* dest) {
  if (utxo != nullptr) {
    UtxoData output(utxo_data);
    memset(utxo, 0, sizeof(Utxo));
    utxo->block_height = utxo_data.block_height;
    utxo->vout = utxo_data.vout;
    utxo->binary_data = utxo_data.binary_data;
    utxo->amount = utxo_data.amount.GetSatoshiValue();

    ByteData block_hash = utxo_data.block_hash.GetData();
    if (!block_hash.Empty()) {
      memcpy(
          utxo->block_hash, block_hash.GetBytes().data(),
          sizeof(utxo->block_hash));
    }
    ByteData txid = utxo_data.txid.GetData();
    if (!txid.Empty()) {
      memcpy(utxo->txid, txid.GetBytes().data(), sizeof(utxo->txid));
    }

    // convert from descriptor
    std::vector<uint8_t> locking_script_bytes;
    if (!utxo_data.descriptor.empty()) {
      NetType net_type = NetType::kMainnet;
      std::vector<AddressFormatData> addr_prefixes =
          cfd::core::GetBitcoinAddressFormatList();
#ifndef CFD_DISABLE_ELEMENTS
      if (!utxo_data.asset.IsEmpty()) {
        std::vector<AddressFormatData> elements_prefixes =
            cfd::core::GetElementsAddressFormatList();
        addr_prefixes = elements_prefixes;
        net_type = NetType::kLiquidV1;
      }
#endif  // CFD_DISABLE_ELEMENTS
      if (!utxo_data.address.GetAddress().empty()) {
        addr_prefixes.clear();
        addr_prefixes.push_back(utxo_data.address.GetAddressFormatData());
        net_type = utxo_data.address.GetNetType();
      }

      Descriptor desc =
          Descriptor::Parse(utxo_data.descriptor, &addr_prefixes);
      if (desc.GetNeedArgumentNum() == 0) {
        std::vector<DescriptorScriptReference> ref_list =
            desc.GetReferenceAll();
        DescriptorScriptReference& script_ref = ref_list[0];
        output.locking_script = script_ref.GetLockingScript();
        locking_script_bytes = output.locking_script.GetData().GetBytes();
        if ((script_ref.GetScriptType() !=
             DescriptorScriptType::kDescriptorScriptRaw) ||
            script_ref.HasAddress()) {
          output.address_type = script_ref.GetAddressType();
          output.address = script_ref.GenerateAddress(net_type);
          if (ref_list[ref_list.size() - 1].HasRedeemScript()) {
            output.redeem_script =
                ref_list[ref_list.size() - 1].GetRedeemScript();
          }
        }
        utxo->address_type = static_cast<uint16_t>(output.address_type);
      }
    }

    if (!locking_script_bytes.empty()) {
      // do nothing
    } else if (!output.address.GetAddress().empty()) {
      output.locking_script = output.address.GetLockingScript();
      locking_script_bytes = output.locking_script.GetData().GetBytes();
      AddressType addr_type = output.address.GetAddressType();
      if ((addr_type == AddressType::kP2shAddress) &&
          ((output.address_type == AddressType::kP2shP2wshAddress) ||
           (output.address_type == AddressType::kP2shP2wpkhAddress))) {
        // direct set. output.address_type;
      } else {
        output.address_type = addr_type;
      }
      utxo->address_type = static_cast<uint16_t>(output.address_type);
    } else if (!utxo_data.locking_script.IsEmpty()) {
      locking_script_bytes = utxo_data.locking_script.GetData().GetBytes();
      if (utxo_data.locking_script.IsP2wpkhScript()) {
        utxo->address_type = AddressType::kP2wpkhAddress;
      } else if (utxo_data.locking_script.IsP2wshScript()) {
        utxo->address_type = AddressType::kP2wshAddress;
      } else if (utxo_data.locking_script.IsP2pkhScript()) {
        utxo->address_type = AddressType::kP2pkhAddress;
      } else if (utxo_data.locking_script.IsTaprootScript()) {
        utxo->address_type = AddressType::kTaprootAddress;
      } else if (
          utxo_data.locking_script.IsWitnessProgram() &&
          (utxo_data.locking_script.GetElementList()[0].GetNumber() != 0)) {
        utxo->address_type = AddressType::kWitnessUnknown;
      } else {  // TODO(k-matsuzawa): unbknown type is convert to p2sh
        utxo->address_type = AddressType::kP2shAddress;
      }
      output.address_type = static_cast<AddressType>(utxo->address_type);
    }

    if (!locking_script_bytes.empty()) {
      utxo->script_length = static_cast<uint16_t>(locking_script_bytes.size());
      if (utxo->script_length < sizeof(utxo->locking_script)) {
        memcpy(
            utxo->locking_script, locking_script_bytes.data(),
            utxo->script_length);
      }
    }

    uint32_t wit_size = 0;
    uint32_t txin_size = 0;
    const Script* scriptsig_template = nullptr;
    if (!output.scriptsig_template.IsEmpty()) {
      scriptsig_template = &output.scriptsig_template;
    }

#ifndef CFD_DISABLE_ELEMENTS
    if (!utxo_data.asset.IsEmpty()) {
      std::vector<uint8_t> asset = utxo_data.asset.GetData().GetBytes();
      memcpy(utxo->asset, asset.data(), sizeof(utxo->asset));
      utxo->blinded = utxo_data.asset.HasBlinding();

      ConfidentialTxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, 0, Script(), false, false,
          &wit_size, &txin_size, false, scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }
#endif  // CFD_DISABLE_ELEMENTS

    if ((wit_size == 0) && (txin_size == 0)) {
      wit_size = 0;
      txin_size = 0;
      TxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, &wit_size, &txin_size,
          scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }

    if (dest != nullptr) {
      *dest = output;
    }
  }
}